

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

string * CLI::detail::extract_binary_string(string *__return_storage_ptr__,string *escaped_string)

{
  char hc;
  char hc_00;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  char *pcVar5;
  uint32_t res2;
  uint32_t res1;
  value_type c2;
  value_type c1;
  size_t loc;
  size_t ssize;
  size_t tail;
  size_t start;
  string *escaped_string_local;
  string *outstring;
  
  tail = 0;
  ssize = 0;
  lVar4 = ::std::__cxx11::string::size();
  iVar1 = ::std::__cxx11::string::compare((ulong)escaped_string,0,(char *)0x3);
  if ((iVar1 == 0) &&
     (iVar1 = ::std::__cxx11::string::compare((ulong)escaped_string,lVar4 - 2,(char *)0x2),
     iVar1 == 0)) {
    tail = 3;
    ssize = 2;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((ulong)escaped_string,0,(char *)0x4);
    if ((iVar1 == 0) &&
       (iVar1 = ::std::__cxx11::string::compare((ulong)escaped_string,lVar4 - 3,(char *)0x3),
       iVar1 == 0)) {
      tail = 4;
      ssize = 3;
    }
  }
  if (tail == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)escaped_string);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  _res1 = tail;
  do {
    while( true ) {
      if (lVar4 - ssize <= _res1) {
        return __return_storage_ptr__;
      }
      pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)escaped_string);
      if ((*pcVar5 == '\\') &&
         ((pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)escaped_string),
          *pcVar5 == 'x' ||
          (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)escaped_string),
          *pcVar5 == 'X')))) break;
LAB_0012e3ce:
      ::std::__cxx11::string::operator[]((ulong)escaped_string);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      _res1 = _res1 + 1;
    }
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)escaped_string);
    hc = *pcVar5;
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)escaped_string);
    hc_00 = *pcVar5;
    uVar2 = hexConvert(hc);
    uVar3 = hexConvert(hc_00);
    if ((0xf < uVar2) || (0xf < uVar3)) goto LAB_0012e3ce;
    _res1 = _res1 + 4;
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  } while( true );
}

Assistant:

CLI11_INLINE std::string extract_binary_string(const std::string &escaped_string) {
    std::size_t start{0};
    std::size_t tail{0};
    size_t ssize = escaped_string.size();
    if(escaped_string.compare(0, 3, "B\"(") == 0 && escaped_string.compare(ssize - 2, 2, ")\"") == 0) {
        start = 3;
        tail = 2;
    } else if(escaped_string.compare(0, 4, "'B\"(") == 0 && escaped_string.compare(ssize - 3, 3, ")\"'") == 0) {
        start = 4;
        tail = 3;
    }

    if(start == 0) {
        return escaped_string;
    }
    std::string outstring;

    outstring.reserve(ssize - start - tail);
    std::size_t loc = start;
    while(loc < ssize - tail) {
        // ssize-2 to skip )" at the end
        if(escaped_string[loc] == '\\' && (escaped_string[loc + 1] == 'x' || escaped_string[loc + 1] == 'X')) {
            auto c1 = escaped_string[loc + 2];
            auto c2 = escaped_string[loc + 3];

            std::uint32_t res1 = hexConvert(c1);
            std::uint32_t res2 = hexConvert(c2);
            if(res1 <= 0x0F && res2 <= 0x0F) {
                loc += 4;
                outstring.push_back(static_cast<char>(res1 * 16 + res2));
                continue;
            }
        }
        outstring.push_back(escaped_string[loc]);
        ++loc;
    }
    return outstring;
}